

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::GenerateAccessorDeclarations
          (SingularString *this,Printer *p)

{
  anon_union_8_2_3066aaf9_for_type_descriptor_ aVar1;
  Descriptor *descriptor;
  Printer *pPVar2;
  bool bVar3;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Span<const_google::protobuf::io::Printer::Sub> vars_02;
  string_view prefix;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  vars;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  Printer *local_290;
  pointer local_288;
  char *local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  Descriptor *local_228;
  undefined1 local_218 [17];
  undefined7 uStack_207;
  undefined8 uStack_200;
  undefined1 local_1f8 [24];
  code *local_1e0;
  undefined1 local_1d8;
  undefined8 local_1d0;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  bool local_1b0;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_1a8;
  string local_158;
  undefined1 local_138 [32];
  Descriptor *local_118;
  anon_union_8_2_2904990b_for_scope_ local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_e8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_78;
  
  local_290 = p;
  bVar3 = protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors
                    ((this->super_FieldGeneratorBase).field_);
  if (bVar3) {
    io::Printer::Emit(local_290,0,0,0x3c);
  }
  stack0xfffffffffffffdf8 = (FileDescriptor *)0xe;
  uStack_200 = "set_allocated_";
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = "";
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)(local_248 + 0x18),(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_218,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(2),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"release_name","");
  descriptor = (Descriptor *)(this->super_FieldGeneratorBase).field_;
  prefix._M_str = (char *)in_R9;
  prefix._M_len = (size_t)"release_";
  SafeFunctionName_abi_cxx11_
            ((string *)local_268,(cpp *)descriptor->containing_type_,descriptor,
             (FieldDescriptor *)&DAT_00000008,prefix);
  io::Printer::Sub::Sub<std::__cxx11::string>
            ((Sub *)&local_e8[0].default_generated_instance_,&local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
  io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::FieldDescriptor,_0>
            ((AnnotationRecord *)(local_138 + 0x10),(this->super_FieldGeneratorBase).field_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  io::Printer::Sub::AnnotatedAs
            ((Sub *)local_218,(Sub *)&local_e8[0].default_generated_instance_,
             (AnnotationRecord *)(local_138 + 0x10));
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  emplace_back<google::protobuf::io::Printer::Sub>
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)(local_248 + 0x18),(Sub *)local_218);
  if (local_1a8._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0 != &local_1c0) {
    operator_delete((void *)local_1d0,
                    CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[(byte)local_1d8]._M_data)
            ((anon_class_1_0_00000001 *)local_248,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_1f8);
  aVar1.message_type = (Descriptor *)(local_218 + 0x10);
  local_1d8 = 0xff;
  if ((Descriptor *)local_218._0_8_ != aVar1.message_type) {
    operator_delete((void *)local_218._0_8_,(ulong)(stack0xfffffffffffffdf8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.containing_oneof != &local_100) {
    operator_delete(local_110.containing_oneof,local_100._M_allocated_capacity + 1);
  }
  if ((FileDescriptor *)local_138._16_8_ != (FileDescriptor *)0x0) {
    operator_delete((void *)local_138._16_8_,(long)local_118 - local_138._16_8_);
  }
  if (local_78._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_c8.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)((anon_class_1_0_00000001 *)local_248,&local_c8);
  local_c8.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if (local_e8[0] != &local_d8) {
    operator_delete(local_e8[0].default_value_enum_,local_d8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  vars_00.len_ = ((long)local_228 - local_248._24_8_ >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_248._24_8_;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)&local_e8[0].default_generated_instance_,local_290,vars_00,false);
  pPVar2 = local_290;
  local_248[0] = '\x04';
  local_248[1] = 0;
  local_248[2] = '\0';
  local_248[3] = 0;
  local_248._4_4_ = 0;
  local_248._8_8_ = (long)"_internal_set_" + 10;
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_218,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_248,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_01.len_ = ((long)(local_218._8_8_ - local_218._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_01.ptr_ = (pointer)local_218._0_8_;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_268,pPVar2,vars_01,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_218);
  pPVar2 = local_290;
  local_138[0] = '\b';
  local_138[1] = 0;
  local_138[2] = '\0';
  local_138[3] = 0;
  local_138._4_4_ = 0;
  local_138._8_8_ = "mutable_";
  prefixes_00.len_ = 0x100000002;
  prefixes_00.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_218,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_138,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_02.len_ = ((long)(local_218._8_8_ - local_218._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_02.ptr_ = (pointer)local_218._0_8_;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_248,pPVar2,vars_02,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_218);
  pPVar2 = local_290;
  local_288 = (pointer)local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"donated","");
  if (local_288 == (pointer)local_278) {
    uStack_200 = local_278._8_8_;
    local_218._0_8_ = aVar1.message_type;
  }
  else {
    local_218._0_8_ = local_288;
  }
  uStack_207 = local_278._1_7_;
  local_218[0x10] = local_278[0];
  local_218._8_8_ = local_280;
  local_280 = (char *)0x0;
  local_278[0] = 0;
  local_288 = (pointer)local_278;
  local_1f8._0_8_ = operator_new(0x18);
  *(SingularString **)local_1f8._0_8_ = this;
  *(Printer ***)&((Descriptor *)local_1f8._0_8_)->field_count_ = &local_290;
  *(undefined1 *)&(((Descriptor *)local_1f8._0_8_)->all_names_).payload_ = 0;
  local_1e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_1f8._8_8_ = (OneofDescriptor *)0x0;
  local_1f8._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_1d8 = 1;
  local_1d0 = &local_1c0;
  local_1c8.default_value_int64_t_ = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0 = false;
  std::__cxx11::string::_M_replace((ulong)&local_1d0,0,(char *)0x0,0x53a374);
  local_1a8._M_engaged = false;
  io::Printer::Emit(pPVar2,local_218,1,0x3ed,
                    "\n            $DEPRECATED$ const ::std::string& $name$() const;\n            //~ Using `Arg_ = const std::string&` will make the type of `arg`\n            //~ default to `const std::string&`, due to reference collapse. This\n            //~ is necessary because there are a handful of users that rely on\n            //~ this default.\n            template <typename Arg_ = const ::std::string&, typename... Args_>\n            $DEPRECATED$ void $set_name$(Arg_&& arg, Args_... args);\n            $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$();\n            $DEPRECATED$ [[nodiscard]] ::std::string* $nullable$ $release_name$();\n            $DEPRECATED$ void $set_allocated_name$(::std::string* $nullable$ value);\n\n            private:\n            const ::std::string& _internal_$name$() const;\n            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const ::std::string& value);\n            ::std::string* $nonnull$ _internal_mutable_$name$();\n            $donated$;\n\n            public:\n          "
                   );
  if (local_1a8._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0 != &local_1c0) {
    operator_delete((void *)local_1d0,
                    CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[(byte)local_1d8]._M_data)
            ((anon_class_1_0_00000001 *)local_138,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_1f8);
  local_1d8 = 0xff;
  if ((Descriptor *)local_218._0_8_ != aVar1.message_type) {
    operator_delete((void *)local_218._0_8_,(ulong)(stack0xfffffffffffffdf8 + 1));
  }
  if (local_288 != (pointer)local_278) {
    operator_delete(local_288,CONCAT71(local_278._1_7_,local_278[0]) + 1);
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_248);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_268);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)&local_e8[0].default_generated_instance_);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)(local_248 + 0x18));
  return;
}

Assistant:

void SingularString::GenerateAccessorDeclarations(io::Printer* p) const {
  // If we're using SingularString for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.
  if (internal::cpp::IsStringFieldWithPrivatizedAccessors(*field_)) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto vars = AnnotatedAccessors(field_, {"", "set_allocated_"});
  vars.push_back(Sub{
      "release_name",
      SafeFunctionName(field_->containing_type(), field_, "release_"),
  }
                     .AnnotatedAs(field_));
  auto v1 = p->WithVars(vars);
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit({{"donated",
            [&] {
              if (!is_inlined()) return;
              p->Emit(R"cc(
                PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
              )cc");
            }}},
          R"cc(
            $DEPRECATED$ const ::std::string& $name$() const;
            //~ Using `Arg_ = const std::string&` will make the type of `arg`
            //~ default to `const std::string&`, due to reference collapse. This
            //~ is necessary because there are a handful of users that rely on
            //~ this default.
            template <typename Arg_ = const ::std::string&, typename... Args_>
            $DEPRECATED$ void $set_name$(Arg_&& arg, Args_... args);
            $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$();
            $DEPRECATED$ [[nodiscard]] ::std::string* $nullable$ $release_name$();
            $DEPRECATED$ void $set_allocated_name$(::std::string* $nullable$ value);

            private:
            const ::std::string& _internal_$name$() const;
            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const ::std::string& value);
            ::std::string* $nonnull$ _internal_mutable_$name$();
            $donated$;

            public:
          )cc");
}